

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNamePrinter.h
# Opt level: O2

void __thiscall psy::C::SyntaxNamePrinter::~SyntaxNamePrinter(SyntaxNamePrinter *this)

{
  ~SyntaxNamePrinter(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API SyntaxNamePrinter final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    enum class Style : char
    {
        Plain,
        Decorated
    };

    void print(const SyntaxNode* node, Style style);
    void print(const SyntaxNode* node, Style style, std::ostream& os);

private:
    virtual void nonterminal(const SyntaxNode* node) override;

    std::vector<std::tuple<const SyntaxNode*, int>> dump_;
}